

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 17_letterCombinationPhonenum.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* letterCombinations(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *digits)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  long lVar4;
  size_type sVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_200;
  allocator<char> local_1ff;
  allocator<char> local_1fe;
  allocator<char> local_1fd;
  allocator<char> local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  string *local_1f0;
  string temp;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  phone;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  q;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_1f8 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&q,"0",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &q.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last,"1",(allocator<char> *)&temp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &q.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last,"abc",(allocator<char> *)&local_190)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_110,"def",&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"ghi",&local_1fa);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"jkl",&local_1fb);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"mno",&local_1fc);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"pqrs",&local_1fd);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"tuv",&local_1fe);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"wxyz",&local_1ff);
  __l._M_len = 10;
  __l._M_array = (iterator)&q;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&phone,__l,&local_200);
  lVar4 = 0x120;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&q.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  if (digits->_M_string_length == 0) {
    (local_1f8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_1f8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_1f8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::
    queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&q);
    (local_1f8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_1f8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_1f8->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"",(allocator<char> *)&temp);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&q,&s);
    std::__cxx11::string::~string((string *)&s);
    local_1f0 = digits;
    while( true ) {
      if (q.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      std::__cxx11::string::string
                ((string *)&s,
                 (string *)
                 q.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&q);
      if (s._M_string_length == digits->_M_string_length) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_1f8,&s);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&temp,
                   (string *)
                   (phone.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   (long)(digits->_M_dataplus)._M_p[s._M_string_length] + -0x30));
        sVar3 = temp._M_string_length;
        _Var2 = temp._M_dataplus;
        for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
          std::operator+(&local_190,&s,_Var2._M_p[sVar5]);
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&q,
                     &local_190);
          std::__cxx11::string::~string((string *)&local_190);
        }
        std::__cxx11::string::~string((string *)&temp);
        digits = local_1f0;
      }
      std::__cxx11::string::~string((string *)&s);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque(&q.c);
  }
  pvVar1 = local_1f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&phone);
  return pvVar1;
}

Assistant:

vector<string> letterCombinations(string digits) {
    vector<string> phone = {"0", "1", "abc", "def", "ghi", "jkl", "mno", "pqrs", "tuv", "wxyz"};
    if(digits.empty())
        return {};
    
    queue<string> q;
    vector<string> ans;
    
    q.push("");

    while(!q.empty()){
        string s = q.front();
        q.pop();
        
        if(s.length() == digits.length())
            ans.push_back(s);
        else{
            string temp = phone[digits[s.length()] - '0'];
            for(auto i : temp)
                q.push(s + i);
        }
    }
    return ans;
}